

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall google::protobuf::TextFormat::Printer::TextGenerator::Outdent(TextGenerator *this)

{
  int iVar1;
  LogMessageDebugFatal aLStack_18 [16];
  
  iVar1 = this->indent_level_;
  if ((iVar1 == 0) || (iVar1 < this->initial_indent_level_)) {
    absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              (aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0x5da);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_18,0x25," Outdent() without matching Indent().");
    absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(aLStack_18);
  }
  else {
    this->indent_level_ = iVar1 + -1;
  }
  return;
}

Assistant:

void Outdent() override {
    if (indent_level_ == 0 || indent_level_ < initial_indent_level_) {
      ABSL_DLOG(FATAL) << " Outdent() without matching Indent().";
      return;
    }

    --indent_level_;
  }